

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<double,double,duckdb::UnaryOperatorWrapper,duckdb::LogGammaOperator>
               (double *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Alloc_hider _Var2;
  size_type sVar3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  OutOfRangeException *pOVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  double dVar11;
  string local_78;
  ulong local_58;
  double *local_50;
  idx_t local_48;
  ulong local_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar6 = 0;
      do {
        dVar11 = ldata[iVar6];
        if ((dVar11 == 0.0) && (!NAN(dVar11))) {
          pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"cannot take log gamma of zero","");
          OutOfRangeException::OutOfRangeException(pOVar5,&local_78);
          __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        dVar11 = lgamma(dVar11);
        result_data[iVar6] = dVar11;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)mask,&local_38);
      sVar3 = local_78._M_string_length;
      _Var2._M_p = local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var2._M_p;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_58 = count + 0x3f >> 6;
      local_40 = 0;
      uVar8 = 0;
      local_50 = result_data;
      local_48 = count;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar9 = puVar1[local_40];
        }
        uVar7 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar7 = count;
        }
        uVar10 = uVar7;
        if (uVar9 != 0) {
          uVar10 = uVar8;
          if (uVar9 == 0xffffffffffffffff) {
            if (uVar8 < uVar7) {
              do {
                dVar11 = ldata[uVar8];
                if ((dVar11 == 0.0) && (!NAN(dVar11))) {
                  pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
                  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_78,"cannot take log gamma of zero","");
                  OutOfRangeException::OutOfRangeException(pOVar5,&local_78);
                  __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                dVar11 = lgamma(dVar11);
                result_data[uVar8] = dVar11;
                uVar8 = uVar8 + 1;
                uVar10 = uVar8;
              } while (uVar7 != uVar8);
            }
          }
          else if (uVar8 < uVar7) {
            uVar10 = 0;
            do {
              if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
                dVar11 = ldata[uVar8 + uVar10];
                if ((dVar11 == 0.0) && (!NAN(dVar11))) {
                  pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
                  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_78,"cannot take log gamma of zero","");
                  OutOfRangeException::OutOfRangeException(pOVar5,&local_78);
                  __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                dVar11 = lgamma(dVar11);
                result_data[uVar8 + uVar10] = dVar11;
              }
              uVar10 = uVar10 + 1;
            } while ((uVar8 - uVar7) + uVar10 != 0);
            uVar10 = uVar8 + uVar10;
            result_data = local_50;
            count = local_48;
          }
        }
        local_40 = local_40 + 1;
        uVar8 = uVar10;
      } while (local_40 != local_58);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}